

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

ssize_t __thiscall DepthBuffer::write(DepthBuffer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  long lVar1;
  size_t j;
  ulong y;
  undefined4 in_register_00000034;
  size_t i;
  ulong x;
  TGAColor local_85;
  char *local_80;
  string local_78;
  TGAImage image;
  
  local_80 = (char *)CONCAT44(in_register_00000034,__fd);
  TGAImage::TGAImage(&image,this->width,this->height,1);
  lVar1 = 0;
  for (x = 0; x < this->width; x = x + 1) {
    for (y = 0; y < this->height; y = y + 1) {
      local_85.bgra[0] =
           (uint8_t)(int)*(double *)
                          ((long)(this->data).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                          y * 8 + this->width * lVar1);
      local_85.bgra[1] = '\0';
      local_85.bgra[2] = '\0';
      local_85.bgra[3] = '\0';
      local_85.bytespp = '\x01';
      TGAImage::set(&image,x,y,&local_85);
    }
    lVar1 = lVar1 + 8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,local_80,(allocator<char> *)&local_85);
  TGAImage::write_tga_file(&image,&local_78,true,true);
  std::__cxx11::string::~string((string *)&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  return extraout_RAX;
}

Assistant:

void DepthBuffer::write(const char *filename) const
{
    TGAImage image(width, height, TGAImage::GRAYSCALE);
    for (size_t i = 0; i < width; i++) {
        for (size_t j = 0; j < height; j++) {
            image.set(i, j, TGAColor(static_cast<uint8_t>(data[i * width + j])));
        }
    }
    image.write_tga_file(filename);
}